

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

int Problem1(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SUNNonlinearSolver *NLS_00;
  double dVar4;
  SUNContext sunctx;
  sunrealtype hu;
  int qu;
  int firstrun;
  void *cvode_mem;
  SUNNonlinearSolver NLS;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector y;
  int nerr;
  int iout;
  int temp_retval;
  int retval;
  int miter;
  sunrealtype er;
  sunrealtype ero;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype abstol;
  sunrealtype reltol;
  undefined8 in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  SUNMatrix *in_stack_ffffffffffffff58;
  N_Vector p_Var5;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  void *in_stack_ffffffffffffff70;
  SUNContext in_stack_ffffffffffffff78;
  undefined1 local_80 [4];
  uint local_7c;
  undefined8 local_78;
  void *pvVar6;
  N_Vector_Ops p_Var7;
  SUNContext pSVar8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar9;
  int local_48;
  int in_stack_ffffffffffffffbc;
  double local_30;
  double local_28;
  undefined1 local_20 [8];
  double local_18;
  undefined8 local_10;
  int local_4;
  
  local_10 = 0;
  local_18 = 1e-06;
  iVar9 = 0;
  pSVar8 = (SUNContext)0x0;
  p_Var7 = (N_Vector_Ops)0x0;
  pvVar6 = (void *)0x0;
  local_78 = 0;
  SUNContext_Create(0,&stack0xffffffffffffff70);
  iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if (iVar1 == 0) {
    NLS_00 = (SUNNonlinearSolver *)N_VNew_Serial(2,in_stack_ffffffffffffff70);
    iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    if (iVar1 == 0) {
      PrintIntro1();
      local_78 = CVodeCreate(1,in_stack_ffffffffffffff70);
      iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      if (iVar1 == 0) {
        for (iVar1 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20), iVar1 < 4;
            iVar1 = iVar1 + 1) {
          local_30 = 0.0;
          (*NLS_00)->sunctx->profiler = (SUNProfiler)0x4000000000000000;
          *(undefined8 *)&(*NLS_00)->sunctx->own_profiler = 0;
          local_7c = (uint)(iVar1 == 0);
          if (local_7c == 0) {
            CVodeReInit(local_78,NLS_00);
            iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
            if (iVar3 != 0) {
              return 1;
            }
          }
          else {
            CVodeInit(local_78,f1,NLS_00);
            iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
            if (iVar2 != 0) {
              return 1;
            }
            CVodeSStolerances(local_10,SUB84(local_18,0),local_78);
            iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
            if (iVar3 != 0) {
              return 1;
            }
          }
          in_stack_ffffffffffffff58 = (SUNMatrix *)&stack0xffffffffffffff98;
          p_Var5 = (N_Vector)&stack0xffffffffffffff90;
          in_stack_ffffffffffffff48 = 0;
          in_stack_ffffffffffffff50 = (char *)0x0;
          iVar3 = PrepareNextRun(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,p_Var5,
                                 in_stack_ffffffffffffff58,(sunindextype)pvVar6,(sunindextype)p_Var7
                                 ,(SUNLinearSolver *)pSVar8,NLS_00);
          iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                               (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
          if (iVar2 != 0) {
            return 1;
          }
          PrintHeader1();
          local_28 = 1.39283880203;
          for (local_48 = 1; local_48 < 5; local_48 = local_48 + 1) {
            iVar3 = CVode(local_28,local_78,NLS_00,local_20,1);
            check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            CVodeGetLastOrder(local_78,local_80);
            iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            if (iVar2 != 0) {
              iVar9 = iVar9 + 1;
            }
            in_stack_ffffffffffffffbc = CVodeGetLastStep(local_78,&stack0xffffffffffffff78);
            iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            if (iVar2 != 0) {
              iVar9 = iVar9 + 1;
            }
            PrintOutput1((sunrealtype)p_Var5,(sunrealtype)in_stack_ffffffffffffff58,
                         (sunrealtype)in_stack_ffffffffffffff50,
                         (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),5.23114235488483e-318);
            if (iVar3 != 0) {
              iVar9 = iVar9 + 1;
              break;
            }
            if (local_48 % 2 == 0) {
              dVar4 = ABS((double)(*NLS_00)->sunctx->profiler) / local_18;
              if (local_30 < dVar4) {
                local_30 = dVar4;
              }
              if (10000.0 < dVar4) {
                iVar9 = iVar9 + 1;
                PrintErrOutput(5.23200202910859e-318);
              }
            }
            local_28 = local_28 + 2.214773875;
          }
          PrintFinalStats((void *)CONCAT44(iVar1,iVar3),in_stack_ffffffffffffffbc,
                          (sunrealtype)CONCAT44(iVar9,in_stack_ffffffffffffffb0));
        }
        CVodeFree(&local_78);
        SUNNonlinSolFree(pvVar6);
        pvVar6 = (void *)0x0;
        p_Var7 = (N_Vector_Ops)0x0;
        pSVar8 = (SUNContext)0x0;
        local_78 = CVodeCreate(2,in_stack_ffffffffffffff70);
        iVar1 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        if (iVar1 == 0) {
          for (iVar1 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20), iVar1 < 4;
              iVar1 = iVar1 + 1) {
            local_30 = 0.0;
            (*NLS_00)->sunctx->profiler = (SUNProfiler)0x4000000000000000;
            *(undefined8 *)&(*NLS_00)->sunctx->own_profiler = 0;
            local_7c = (uint)(iVar1 == 0);
            if (local_7c == 0) {
              CVodeReInit(local_78,NLS_00);
              iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
              if (iVar3 != 0) {
                return 1;
              }
            }
            else {
              CVodeInit(local_78,f1,NLS_00);
              iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
              if (iVar2 != 0) {
                return 1;
              }
              CVodeSStolerances(local_10,SUB84(local_18,0),local_78);
              iVar3 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar3);
              if (iVar3 != 0) {
                return 1;
              }
            }
            in_stack_ffffffffffffff58 = (SUNMatrix *)&stack0xffffffffffffff98;
            p_Var5 = (N_Vector)&stack0xffffffffffffff90;
            in_stack_ffffffffffffff48 = 0;
            in_stack_ffffffffffffff50 = (char *)0x0;
            iVar3 = PrepareNextRun(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,p_Var5,
                                   in_stack_ffffffffffffff58,(sunindextype)pvVar6,
                                   (sunindextype)p_Var7,(SUNLinearSolver *)pSVar8,NLS_00);
            iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            if (iVar2 != 0) {
              return 1;
            }
            PrintHeader1();
            local_28 = 1.39283880203;
            for (local_48 = 1; local_48 < 5; local_48 = local_48 + 1) {
              iVar3 = CVode(local_28,local_78,NLS_00,local_20,1);
              check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              CVodeGetLastOrder(local_78,local_80);
              iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              if (iVar2 != 0) {
                iVar9 = iVar9 + 1;
              }
              in_stack_ffffffffffffffbc = CVodeGetLastStep(local_78,&stack0xffffffffffffff78);
              iVar2 = check_retval(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                   (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
              if (iVar2 != 0) {
                iVar9 = iVar9 + 1;
              }
              PrintOutput1((sunrealtype)p_Var5,(sunrealtype)in_stack_ffffffffffffff58,
                           (sunrealtype)in_stack_ffffffffffffff50,
                           (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),5.23647826385991e-318);
              if (iVar3 != 0) {
                iVar9 = iVar9 + 1;
                break;
              }
              if (local_48 % 2 == 0) {
                dVar4 = ABS((double)(*NLS_00)->sunctx->profiler) / local_18;
                if (local_30 < dVar4) {
                  local_30 = dVar4;
                }
                if (10000.0 < dVar4) {
                  iVar9 = iVar9 + 1;
                  PrintErrOutput(5.23733793808368e-318);
                }
              }
              local_28 = local_28 + 2.214773875;
            }
            PrintFinalStats((void *)CONCAT44(iVar1,iVar3),in_stack_ffffffffffffffbc,
                            (sunrealtype)CONCAT44(iVar9,in_stack_ffffffffffffffb0));
          }
          CVodeFree(&local_78);
          SUNNonlinSolFree(pvVar6);
          N_VDestroy(NLS_00);
          SUNContext_Free(&stack0xffffffffffffff70);
          local_4 = iVar9;
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int Problem1(void)
{
  sunrealtype reltol = RTOL, abstol = ATOL, t, tout, ero, er;
  int miter, retval, temp_retval, iout, nerr = 0;
  N_Vector y;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  void* cvode_mem;
  sunbooleantype firstrun;
  int qu;
  sunrealtype hu;
  SUNContext sunctx;

  y         = NULL;
  A         = NULL;
  LS        = NULL;
  NLS       = NULL;
  cvode_mem = NULL;

  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  y = N_VNew_Serial(P1_NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  PrintIntro1();

  cvode_mem = CVodeCreate(CV_ADAMS, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  for (miter = FUNC; miter <= DIAG; miter++)
  {
    ero            = ZERO;
    NV_Ith_S(y, 0) = TWO;
    NV_Ith_S(y, 1) = ZERO;

    firstrun = (miter == FUNC);
    if (firstrun)
    {
      /* initialize CVode */
      retval = CVodeInit(cvode_mem, f1, P1_T0, y);
      if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

      /* set scalar tolerances */
      retval = CVodeSStolerances(cvode_mem, reltol, abstol);
      if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }
    }
    else
    {
      /* reinitialize CVode */
      retval = CVodeReInit(cvode_mem, P1_T0, y);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    retval = PrepareNextRun(sunctx, cvode_mem, CV_ADAMS, miter, y, &A, 0, 0,
                            &LS, &NLS);
    if (check_retval(&retval, "PrepareNextRun", 1)) { return (1); }

    PrintHeader1();

    for (iout = 1, tout = P1_T1; iout <= P1_NOUT; iout++, tout += P1_DTOUT)
    {
      retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
      check_retval(&retval, "CVode", 1);
      temp_retval = CVodeGetLastOrder(cvode_mem, &qu);
      if (check_retval(&temp_retval, "CVodeGetLastOrder", 1)) { ++nerr; }
      temp_retval = CVodeGetLastStep(cvode_mem, &hu);
      if (check_retval(&temp_retval, "CVodeGetLastStep", 1)) { ++nerr; }
      PrintOutput1(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), qu, hu);
      if (retval != CV_SUCCESS)
      {
        nerr++;
        break;
      }
      if (iout % 2 == 0)
      {
        er = fabs(NV_Ith_S(y, 0)) / abstol;
        if (er > ero) { ero = er; }
        if (er > P1_TOL_FACTOR)
        {
          nerr++;
          PrintErrOutput(P1_TOL_FACTOR);
        }
      }
    }

    PrintFinalStats(cvode_mem, miter, ero);
  }

  CVodeFree(&cvode_mem);
  SUNNonlinSolFree(NLS);
  NLS = NULL;
  LS  = NULL;
  A   = NULL;

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  for (miter = FUNC; miter <= DIAG; miter++)
  {
    ero            = ZERO;
    NV_Ith_S(y, 0) = TWO;
    NV_Ith_S(y, 1) = ZERO;

    firstrun = (miter == FUNC);
    if (firstrun)
    {
      /* initialize CVode */
      retval = CVodeInit(cvode_mem, f1, P1_T0, y);
      if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

      /* set scalar tolerances */
      retval = CVodeSStolerances(cvode_mem, reltol, abstol);
      if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }
    }
    else
    {
      /* reinitialize CVode */
      retval = CVodeReInit(cvode_mem, P1_T0, y);
      if (check_retval(&retval, "CVodeReInit", 1)) { return (1); }
    }

    retval = PrepareNextRun(sunctx, cvode_mem, CV_BDF, miter, y, &A, 0, 0, &LS,
                            &NLS);
    if (check_retval(&retval, "PrepareNextRun", 1)) { return (1); }

    PrintHeader1();

    for (iout = 1, tout = P1_T1; iout <= P1_NOUT; iout++, tout += P1_DTOUT)
    {
      retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
      check_retval(&retval, "CVode", 1);
      temp_retval = CVodeGetLastOrder(cvode_mem, &qu);
      if (check_retval(&temp_retval, "CVodeGetLastOrder", 1)) { ++nerr; }
      temp_retval = CVodeGetLastStep(cvode_mem, &hu);
      if (check_retval(&temp_retval, "CVodeGetLastStep", 1)) { ++nerr; }
      PrintOutput1(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), qu, hu);
      if (retval != CV_SUCCESS)
      {
        nerr++;
        break;
      }
      if (iout % 2 == 0)
      {
        er = fabs(NV_Ith_S(y, 0)) / abstol;
        if (er > ero) { ero = er; }
        if (er > P1_TOL_FACTOR)
        {
          nerr++;
          PrintErrOutput(P1_TOL_FACTOR);
        }
      }
    }

    PrintFinalStats(cvode_mem, miter, ero);
  }

  CVodeFree(&cvode_mem);
  SUNNonlinSolFree(NLS);
  N_VDestroy(y);
  SUNContext_Free(&sunctx);

  return (nerr);
}